

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O2

float ncnn::activation_ss(float v,int activation_type,Mat *activation_params)

{
  float fVar1;
  
  switch(activation_type) {
  case 1:
    if (v <= 0.0) {
      v = 0.0;
    }
    break;
  case 2:
    fVar1 = (float)(~-(uint)(0.0 < v) & *activation_params->data | -(uint)(0.0 < v) & 0x3f800000);
    goto LAB_00457002;
  case 3:
    fVar1 = *activation_params->data;
    if (v <= fVar1) {
      v = fVar1;
    }
    fVar1 = *(float *)((long)activation_params->data + 4);
    if (fVar1 <= v) {
      v = fVar1;
    }
    break;
  case 4:
    fVar1 = expf(-v);
    v = 1.0 / (fVar1 + 1.0);
    break;
  case 5:
    fVar1 = expf(v);
    fVar1 = logf(fVar1 + 1.0);
    fVar1 = tanhf(fVar1);
LAB_00457002:
    v = v * fVar1;
  }
  return v;
}

Assistant:

static inline float activation_ss(float v, int activation_type, const ncnn::Mat& activation_params)
{
    if (activation_type == 1)
    {
        v = fmax(v, 0.f);
    }
    else if (activation_type == 2)
    {
        float slope = activation_params[0];
        v = v > 0.f ? v : v * slope;
    }
    else if (activation_type == 3)
    {
        float min = activation_params[0];
        float max = activation_params[1];
        if (v < min)
            v = min;
        if (v > max)
            v = max;
    }
    else if (activation_type == 4)
    {
        v = 1.f / (1.f + exp(-v));
    }
    else if (activation_type == 5)
    {
        v = v * tanh(log(exp(v) + 1.f));
    }

    return v;
}